

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O3

void tcg_gen_shrv_mod_vec(TCGContext_conflict9 *tcg_ctx,uint vece,TCGv_vec d,TCGv_vec a,TCGv_vec b)

{
  TCGv_vec r;
  uintptr_t o;
  
  r = tcg_temp_new_vec_matching_tricore(tcg_ctx,d);
  tcg_gen_dupi_vec_tricore(tcg_ctx,vece,r,(long)((8 << ((byte)vece & 0x1f)) + -1));
  tcg_gen_and_vec_tricore(tcg_ctx,vece,r,r,b);
  tcg_gen_shrv_vec_tricore(tcg_ctx,vece,d,a,r);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(r + (long)tcg_ctx));
  return;
}

Assistant:

static void tcg_gen_shrv_mod_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec d,
                                 TCGv_vec a, TCGv_vec b)
{
    TCGv_vec t = tcg_temp_new_vec_matching(tcg_ctx, d);

    tcg_gen_dupi_vec(tcg_ctx, vece, t, (8 << vece) - 1);
    tcg_gen_and_vec(tcg_ctx, vece, t, t, b);
    tcg_gen_shrv_vec(tcg_ctx, vece, d, a, t);
    tcg_temp_free_vec(tcg_ctx, t);
}